

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditorImage::~CEditorImage(CEditorImage *this)

{
  IGraphics *pIVar1;
  void *p;
  
  pIVar1 = this->m_pEditor->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,&this->m_Texture);
  p = (this->super_CImageInfo).m_pData;
  if (p != (void *)0x0) {
    mem_free(p);
    (this->super_CImageInfo).m_pData = (void *)0x0;
  }
  if (this->m_pAutoMapper != (IAutoMapper *)0x0) {
    (*this->m_pAutoMapper->_vptr_IAutoMapper[1])();
    this->m_pAutoMapper = (IAutoMapper *)0x0;
  }
  return;
}

Assistant:

CEditorImage::~CEditorImage()
{
	m_pEditor->Graphics()->UnloadTexture(&m_Texture);
	if(m_pData)
	{
		mem_free(m_pData);
		m_pData = 0;
	}
	if(m_pAutoMapper)
	{
		delete m_pAutoMapper;
		m_pAutoMapper = 0;
	}
}